

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astmem.cpp
# Opt level: O0

int main(int argc,char **argsv)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  pointer pEVar3;
  ostream *this;
  string local_398 [36];
  undefined4 local_374;
  undefined1 local_370 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Parser parser;
  undefined1 local_300 [8];
  Logger log;
  string local_2d0;
  undefined1 local_2b0 [8];
  Lexer lex;
  LanguageConfiguration cfg;
  allocator<char> local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  char **argsv_local;
  int argc_local;
  
  if ((argc == 2) && (sVar2 = strlen(argsv[1]), sVar2 != 0)) {
    __s = argsv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b8,__s,&local_1b9);
    std::__cxx11::istringstream::istringstream(local_198,local_1b8,8);
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    lex.lastComment.field_2._10_2_ = 0x100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"<args[1]>",(allocator<char> *)((long)&log.baseLog.err + 7));
    pfederc::Lexer::Lexer
              ((Lexer *)local_2b0,(LanguageConfiguration *)((long)&lex.lastComment.field_2 + 10),
               (istream *)local_198,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&log.baseLog.err + 7));
    pfederc::BaseLogger::BaseLogger
              ((BaseLogger *)&parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              ((Logger *)local_300,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               (BaseLogger *)&parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pfederc::BaseLogger::~BaseLogger
              ((BaseLogger *)&parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    pfederc::Lexer::next((Lexer *)local_2b0);
    pfederc::Parser::Parser((Parser *)&expr,(Lexer *)local_2b0);
    pfederc::Parser::parseExpression((Parser *)local_370,(Precedence)&expr);
    pfederc::logLexerErrors((Logger *)local_300,(Lexer *)local_2b0);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_370);
    if (bVar1) {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          local_370);
      (*pEVar3->_vptr_Expr[2])();
      this = std::operator<<((ostream *)&std::cout,local_398);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_398);
    }
    else {
      pfederc::logParserErrors((Logger *)local_300,(Parser *)&expr);
    }
    local_374 = 1;
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_370);
    pfederc::Parser::~Parser((Parser *)&expr);
    pfederc::Logger::~Logger((Logger *)local_300);
    pfederc::Lexer::~Lexer((Lexer *)local_2b0);
    std::__cxx11::istringstream::~istringstream(local_198);
    return 0;
  }
  return 1;
}

Assistant:

int main(int argc, char * argsv[]) {
  if (argc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(argsv[1]);
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");

  Logger log;
  
  lex.next();
  Parser parser(lex);
  auto expr = parser.parseExpression();

  logLexerErrors(log, lex);

  if (!expr) {
    logParserErrors(log, parser);
    return 0;
  }

  std::cout << expr->toString() << std::endl;

  return 0;
}